

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

int Search::choose_policy(search_private *priv,bool advance_prng)

{
  SearchState SVar1;
  byte allow_current;
  int iVar2;
  vw_exception *this;
  RollMethod RVar3;
  bool allow_optimal;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  SVar1 = priv->state;
  if (SVar1 == INIT_TEST) {
    RVar3 = POLICY;
  }
  else if (SVar1 == INIT_TRAIN) {
    RVar3 = priv->rollin_method;
  }
  else if (SVar1 == LEARN) {
    RVar3 = priv->rollout_method;
  }
  else {
    RVar3 = NO_ROLLOUT;
  }
  switch(RVar3) {
  case POLICY:
    allow_current = SVar1 == INIT_TEST | priv->allow_current_policy;
    allow_optimal = false;
    break;
  case ORACLE:
    return -1;
  case MIX_PER_STATE:
    allow_current = priv->allow_current_policy;
    allow_optimal = true;
    break;
  case MIX_PER_ROLL:
    if (priv->mix_per_roll_policy == -2) {
      iVar2 = random_policy(priv,priv->allow_current_policy,true,advance_prng);
      priv->mix_per_roll_policy = iVar2;
    }
    return priv->mix_per_roll_policy;
  default:
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_190,"internal error (bug): trying to rollin or rollout with NO_ROLLOUT",0x41);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
               ,0x540,&local_1c0);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  iVar2 = random_policy(priv,(bool)allow_current,allow_optimal,advance_prng);
  return iVar2;
}

Assistant:

int choose_policy(search_private& priv, bool advance_prng = true)
{
  RollMethod method = (priv.state == INIT_TEST) ? POLICY
                                                : (priv.state == LEARN)
          ? priv.rollout_method
          : (priv.state == INIT_TRAIN) ? priv.rollin_method : NO_ROLLOUT;  // this should never happen
  switch (method)
  {
    case POLICY:
      return random_policy(priv, priv.allow_current_policy || (priv.state == INIT_TEST), false, advance_prng);

    case ORACLE:
      return -1;

    case MIX_PER_STATE:
      return random_policy(priv, priv.allow_current_policy, true, advance_prng);

    case MIX_PER_ROLL:
      if (priv.mix_per_roll_policy == -2)  // then we have to choose one!
        priv.mix_per_roll_policy = random_policy(priv, priv.allow_current_policy, true, advance_prng);
      return priv.mix_per_roll_policy;

    case NO_ROLLOUT:
    default:
      THROW("internal error (bug): trying to rollin or rollout with NO_ROLLOUT");
  }
}